

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O2

UnicodeString *
icu_63::TimeZoneFormat::expandOffsetPattern
          (UnicodeString *offsetHM,UnicodeString *result,UErrorCode *status)

{
  int32_t len;
  int32_t iVar1;
  ConstChar16Ptr local_b8;
  char16_t *local_b0;
  UnicodeString local_a0;
  UnicodeString sep;
  
  UnicodeString::setToBogus(result);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    len = UnicodeString::indexOf(offsetHM,L"mm",2,0);
    if (len < 0) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      sep.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003d8fe8;
      sep.fUnion.fStackFields.fLengthAndFlags = 2;
      UnicodeString::tempSubString(&local_a0,offsetHM,0,len);
      iVar1 = UnicodeString::lastIndexOf(&local_a0,L'H');
      UnicodeString::~UnicodeString(&local_a0);
      if (-1 < iVar1) {
        UnicodeString::tempSubString(&local_a0,offsetHM,iVar1 + 1,len - (iVar1 + 1));
        UnicodeString::moveFrom(&sep,&local_a0);
        UnicodeString::~UnicodeString(&local_a0);
      }
      UnicodeString::tempSubString(&local_a0,offsetHM,0,len + 2);
      UnicodeString::setTo(result,&local_a0);
      UnicodeString::~UnicodeString(&local_a0);
      UnicodeString::append(result,&sep);
      local_b8.p_ = L"ss";
      UnicodeString::append(result,&local_b8,-1);
      local_b0 = local_b8.p_;
      UnicodeString::tempSubString(&local_a0,offsetHM,len + 2,0x7fffffff);
      UnicodeString::append(result,&local_a0);
      UnicodeString::~UnicodeString(&local_a0);
      UnicodeString::~UnicodeString(&sep);
    }
  }
  return result;
}

Assistant:

UnicodeString&
TimeZoneFormat::expandOffsetPattern(const UnicodeString& offsetHM, UnicodeString& result, UErrorCode& status) {
    result.setToBogus();
    if (U_FAILURE(status)) {
        return result;
    }
    U_ASSERT(u_strlen(DEFAULT_GMT_OFFSET_MINUTE_PATTERN) == 2);

    int32_t idx_mm = offsetHM.indexOf(DEFAULT_GMT_OFFSET_MINUTE_PATTERN, 2, 0);
    if (idx_mm < 0) {
        // Bad time zone hour pattern data
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return result;
    }

    UnicodeString sep;
    int32_t idx_H = offsetHM.tempSubString(0, idx_mm).lastIndexOf((UChar)0x0048 /* H */);
    if (idx_H >= 0) {
        sep = offsetHM.tempSubString(idx_H + 1, idx_mm - (idx_H + 1));
    }
    result.setTo(offsetHM.tempSubString(0, idx_mm + 2));
    result.append(sep);
    result.append(DEFAULT_GMT_OFFSET_SECOND_PATTERN, -1);
    result.append(offsetHM.tempSubString(idx_mm + 2));
    return result;
}